

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf_crypt_fuzzer.cc
# Opt level: O0

void __thiscall FuzzHelper::testWrite(FuzzHelper *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar1;
  shared_ptr<QPDFWriter> local_80;
  shared_ptr<QPDF> local_70;
  undefined1 local_60 [48];
  undefined1 local_30 [8];
  shared_ptr<QPDFWriter> w;
  shared_ptr<QPDF> q;
  FuzzHelper *this_local;
  
  std::shared_ptr<QPDF>::shared_ptr
            ((shared_ptr<QPDF> *)
             &w.super___shared_ptr<QPDFWriter,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<QPDFWriter>::shared_ptr((shared_ptr<QPDFWriter> *)local_30);
  getQpdf((FuzzHelper *)(local_60 + 0x20));
  this_00 = &w.super___shared_ptr<QPDFWriter,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  std::shared_ptr<QPDF>::operator=
            ((shared_ptr<QPDF> *)this_00,(shared_ptr<QPDF> *)(local_60 + 0x20));
  std::shared_ptr<QPDF>::~shared_ptr((shared_ptr<QPDF> *)(local_60 + 0x20));
  std::shared_ptr<QPDF>::shared_ptr(&local_70,(shared_ptr<QPDF> *)this_00);
  getWriter((FuzzHelper *)local_60,(shared_ptr<QPDF> *)this);
  std::shared_ptr<QPDFWriter>::operator=
            ((shared_ptr<QPDFWriter> *)local_30,(shared_ptr<QPDFWriter> *)local_60);
  std::shared_ptr<QPDFWriter>::~shared_ptr((shared_ptr<QPDFWriter> *)local_60);
  std::shared_ptr<QPDF>::~shared_ptr(&local_70);
  peVar1 = std::__shared_ptr_access<QPDFWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      local_30);
  QPDFWriter::setStaticID(peVar1,true);
  peVar1 = std::__shared_ptr_access<QPDFWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      local_30);
  QPDFWriter::setLinearization(peVar1,true);
  peVar1 = std::__shared_ptr_access<QPDFWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      local_30);
  QPDFWriter::setR6EncryptionParameters
            (peVar1,"u","o",true,true,true,true,true,true,qpdf_r3p_full,true);
  std::shared_ptr<QPDFWriter>::shared_ptr(&local_80,(shared_ptr<QPDFWriter> *)local_30);
  doWrite(this,&local_80);
  std::shared_ptr<QPDFWriter>::~shared_ptr(&local_80);
  std::shared_ptr<QPDFWriter>::~shared_ptr((shared_ptr<QPDFWriter> *)local_30);
  std::shared_ptr<QPDF>::~shared_ptr
            ((shared_ptr<QPDF> *)
             &w.super___shared_ptr<QPDFWriter,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

void
FuzzHelper::testWrite()
{
    // Write in various ways to exercise QPDFWriter

    std::shared_ptr<QPDF> q;
    std::shared_ptr<QPDFWriter> w;

    q = getQpdf();
    w = getWriter(q);
    w->setStaticID(true);
    w->setLinearization(true);
    w->setR6EncryptionParameters("u", "o", true, true, true, true, true, true, qpdf_r3p_full, true);
    doWrite(w);
}